

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O0

uint32 acmod_set_has_attrib(acmod_set_t *acmod_set,acmod_id_t id,char *attrib)

{
  int iVar1;
  uint local_38;
  uint32 i;
  uint32 addr;
  char **attrib_list;
  char *attrib_local;
  acmod_id_t id_local;
  acmod_set_t *acmod_set_local;
  
  if (attrib != (char *)0x0) {
    if (id < acmod_set->n_ci) {
      _i = acmod_set->ci[id].attrib;
    }
    else {
      if (acmod_set->next_id <= id) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                ,0x33e,"Phone id %u is out of range.\n",(ulong)id);
        return 0;
      }
      _i = acmod_set->multi[id - acmod_set->n_ci].attrib;
    }
    if (_i == (char **)0x0) {
      __assert_fail("attrib_list",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
                    ,0x343,"uint32 acmod_set_has_attrib(acmod_set_t *, acmod_id_t, const char *)");
    }
    for (local_38 = 0; _i[local_38] != (char *)0x0; local_38 = local_38 + 1) {
      iVar1 = strcmp(_i[local_38],attrib);
      if (iVar1 == 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

uint32
acmod_set_has_attrib(acmod_set_t *acmod_set,
		     acmod_id_t id,
		     const char *attrib)
{
    char **attrib_list;
    uint32 addr;
    uint32 i;

    if (attrib == NULL)
	return FALSE;

    if (id < acmod_set->n_ci) {
	attrib_list = acmod_set->ci[id].attrib;
    }
    else if (id < acmod_set->next_id) {
	addr = id - acmod_set->n_ci;

	attrib_list = acmod_set->multi[addr].attrib;
    }
    else {
	E_ERROR("Phone id %u is out of range.\n", id);

	return FALSE;
    }

    assert(attrib_list);

    for (i = 0; attrib_list[i]; i++) {
	if (strcmp(attrib_list[i], attrib) == 0)
	    return TRUE;
    }

    return FALSE;
}